

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

bool CheckTxScripts(CTransaction *tx,
                   map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                   *map_prevout_scriptPubKeys,
                   map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *map_prevout_values,uint flags,PrecomputedTransactionData *txdata,string *strTest
                   ,bool expect_valid)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  mapped_type *scriptPubKey;
  string *psVar6;
  PrecomputedTransactionData *checker;
  iterator pvVar7;
  iterator pvVar8;
  string *serror;
  ulong uVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  check_type cVar10;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  assertion_result local_128 [2];
  ScriptError err;
  string local_e8;
  undefined1 local_c8 [8];
  element_type *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b8;
  PrecomputedTransactionData *local_a8;
  CTxIn input;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  err = (ScriptError)expect_valid;
  bVar3 = true;
  uVar9 = 0;
  checker = txdata;
  serror = strTest;
  while( true ) {
    pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68) <= uVar9) ||
       (bVar3 == false)) break;
    CTxIn::CTxIn(&input,pCVar2 + uVar9);
    sVar4 = std::
            map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::count(map_prevout_values,&input.prevout);
    if (sVar4 == 0) {
      psVar6 = (string *)0x0;
    }
    else {
      pmVar5 = std::
               map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
               ::at(map_prevout_values,&input.prevout);
      psVar6 = (string *)*pmVar5;
    }
    scriptPubKey = std::
                   map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                   ::at(map_prevout_scriptPubKeys,&input.prevout);
    local_c8 = (undefined1  [8])&PTR_CheckECDSASignature_0113e8f0;
    aStack_b8._M_allocated_capacity = uVar9 << 0x20;
    checker = (PrecomputedTransactionData *)local_c8;
    serror = (string *)&err;
    local_c0 = (element_type *)tx;
    aStack_b8._8_8_ = psVar6;
    local_a8 = txdata;
    bVar3 = VerifyScript(&input.scriptSig,scriptPubKey,&input.scriptWitness,flags,
                         (BaseSignatureChecker *)checker,(ScriptError *)serror);
    if (expect_valid) {
      local_148 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
      ;
      local_140 = "";
      local_158 = &boost::unit_test::basic_cstring<char_const>::null;
      local_150 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = (iterator)serror;
      msg.m_begin = (iterator)checker;
      file.m_end = (iterator)0x88;
      file.m_begin = (iterator)&local_148;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg)
      ;
      local_e8._M_string_length = 0;
      local_e8.field_2._0_8_ = 0;
      local_c0 = (element_type *)((ulong)local_c0 & 0xffffffffffffff00);
      local_c8 = (undefined1  [8])&PTR__lazy_ostream_01139e30;
      aStack_b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_168 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
      ;
      local_160 = "";
      pvVar7 = &DAT_00000001;
      pvVar8 = &DAT_00000001;
      local_e8._M_dataplus._M_p._0_1_ = bVar3;
      aStack_b8._8_8_ = strTest;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_e8,(lazy_ostream *)local_c8,1,1,WARN,_cVar10,
                 (size_t)&local_168,0x88);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_e8.field_2._M_allocated_capacity);
      local_178 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
      ;
      local_170 = "";
      local_188 = &boost::unit_test::basic_cstring<char_const>::null;
      local_180 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_00.m_end = pvVar8;
      msg_00.m_begin = pvVar7;
      file_00.m_end = (iterator)0x89;
      file_00.m_begin = (iterator)&local_178;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
                 msg_00);
      local_128[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
           = (readonly_property<bool>)(err == SCRIPT_ERR_OK);
      local_128[0].m_message.px = (element_type *)0x0;
      local_128[0].m_message.pn.pi_ = (sp_counted_base *)0x0;
      ScriptErrorString_abi_cxx11_(&local_e8,err);
      local_c0 = (element_type *)((ulong)local_c0 & 0xffffffffffffff00);
      local_c8 = (undefined1  [8])&PTR__lazy_ostream_01139e30;
      aStack_b8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
      local_198 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
      ;
      local_190 = "";
      checker = (PrecomputedTransactionData *)&DAT_00000001;
      serror = (string *)&DAT_00000001;
      aStack_b8._8_8_ = &local_e8;
      boost::test_tools::tt_detail::report_assertion
                (local_128,(lazy_ostream *)local_c8,1,1,WARN,_cVar10,(size_t)&local_198,0x89);
      std::__cxx11::string::~string((string *)&local_e8);
      boost::detail::shared_count::~shared_count(&local_128[0].m_message.pn);
      err = SCRIPT_ERR_UNKNOWN_ERROR;
    }
    CTxIn::~CTxIn(&input);
    uVar9 = (ulong)((int)uVar9 + 1);
  }
  if (!expect_valid) {
    local_1a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
    ;
    local_1a0 = "";
    local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = (iterator)serror;
    msg_01.m_begin = (iterator)checker;
    file_01.m_end = (iterator)0x8e;
    file_01.m_begin = (iterator)&local_1a8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1b8,
               msg_01);
    local_c8 = (undefined1  [8])(CONCAT71(local_c8._1_7_,~bVar3) & 0xffffffffffffff01);
    local_c0 = (element_type *)0x0;
    aStack_b8._M_allocated_capacity = 0;
    input.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    input.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         &PTR__lazy_ostream_01139e30;
    input.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
    ;
    local_1c0 = "";
    pvVar7 = &DAT_00000001;
    pvVar8 = &DAT_00000001;
    input.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = strTest;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_c8,(lazy_ostream *)&input,1,1,WARN,_cVar10,
               (size_t)&local_1c8,0x8e);
    boost::detail::shared_count::~shared_count((shared_count *)&aStack_b8);
    local_1d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
    ;
    local_1d0 = "";
    local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar8;
    msg_02.m_begin = pvVar7;
    file_02.m_end = (iterator)0x8f;
    file_02.m_begin = (iterator)&local_1d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e8,
               msg_02);
    local_e8._M_dataplus._M_p._0_1_ = err != SCRIPT_ERR_OK;
    local_e8._M_string_length = 0;
    local_e8.field_2._0_8_ = 0;
    ScriptErrorString_abi_cxx11_((string *)local_c8,err);
    input.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    input.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
         &PTR__lazy_ostream_01139e30;
    input.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
         boost::unit_test::lazy_ostream::inst;
    local_1f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
    ;
    local_1f0 = "";
    input.prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ = (string *)local_c8;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_e8,(lazy_ostream *)&input,1,1,WARN,_cVar10,
               (size_t)&local_1f8,0x8f);
    std::__cxx11::string::~string((string *)local_c8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_e8.field_2._M_allocated_capacity);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)((bVar3 ^ expect_valid ^ 1U) & 1);
}

Assistant:

bool CheckTxScripts(const CTransaction& tx, const std::map<COutPoint, CScript>& map_prevout_scriptPubKeys,
    const std::map<COutPoint, int64_t>& map_prevout_values, unsigned int flags,
    const PrecomputedTransactionData& txdata, const std::string& strTest, bool expect_valid)
{
    bool tx_valid = true;
    ScriptError err = expect_valid ? SCRIPT_ERR_UNKNOWN_ERROR : SCRIPT_ERR_OK;
    for (unsigned int i = 0; i < tx.vin.size() && tx_valid; ++i) {
        const CTxIn input = tx.vin[i];
        const CAmount amount = map_prevout_values.count(input.prevout) ? map_prevout_values.at(input.prevout) : 0;
        try {
            tx_valid = VerifyScript(input.scriptSig, map_prevout_scriptPubKeys.at(input.prevout),
                &input.scriptWitness, flags, TransactionSignatureChecker(&tx, i, amount, txdata, MissingDataBehavior::ASSERT_FAIL), &err);
        } catch (...) {
            BOOST_ERROR("Bad test: " << strTest);
            return true; // The test format is bad and an error is thrown. Return true to silence further error.
        }
        if (expect_valid) {
            BOOST_CHECK_MESSAGE(tx_valid, strTest);
            BOOST_CHECK_MESSAGE((err == SCRIPT_ERR_OK), ScriptErrorString(err));
            err = SCRIPT_ERR_UNKNOWN_ERROR;
        }
    }
    if (!expect_valid) {
        BOOST_CHECK_MESSAGE(!tx_valid, strTest);
        BOOST_CHECK_MESSAGE((err != SCRIPT_ERR_OK), ScriptErrorString(err));
    }
    return (tx_valid == expect_valid);
}